

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2cf7d15::DWARFObjInMemory::forEachTypesDWOSections
          (DWARFObjInMemory *this,function_ref<void_(const_llvm::DWARFSection_&)> F)

{
  pointer ppVar1;
  pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap> *P;
  pointer ppVar2;
  
  ppVar1 = (this->TypesDWOSections).Vector.
           super__Vector_base<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar2 = (this->TypesDWOSections).Vector.
                super__Vector_base<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar2 != ppVar1; ppVar2 = ppVar2 + 1) {
    (*F.callback)(F.callable,&(ppVar2->second).super_DWARFSection);
  }
  return;
}

Assistant:

void forEachTypesDWOSections(
      function_ref<void(const DWARFSection &)> F) const override {
    for (auto &P : TypesDWOSections)
      F(P.second);
  }